

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_interface.cc
# Opt level: O0

double lf::geometry::Volume(Geometry *geo)

{
  double dVar1;
  RefElType RVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *this;
  Scalar *pSVar5;
  Matrix<double,__1,__1,_0,__1,__1> local_328;
  Matrix<double,__1,_1,_0,__1,_1> local_310;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  RefEl local_289;
  string local_288;
  stringstream local_268 [8];
  stringstream ss;
  ostream local_258 [376];
  Scalar local_e0;
  Scalar local_d8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d0;
  Scalar local_b0;
  Scalar local_a8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a0;
  Scalar local_80;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  undefined4 local_58;
  RefEl local_41;
  double local_40;
  double refvol;
  undefined1 local_30 [8];
  Matrix<double,__1,_1,_0,__1,_1> refc;
  dim_t refdim;
  Geometry *geo_local;
  
  refc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       (**geo->_vptr_Geometry)();
  refvol._4_4_ = 1;
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<unsigned_int,int>
            ((Matrix<double,_1,1,0,_1,1> *)local_30,
             (uint *)((long)&refc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 4),(int *)((long)&refvol + 4));
  local_40 = 1.0;
  iVar3 = (*geo->_vptr_Geometry[2])();
  local_41.type_ = (RefElType)iVar3;
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_41);
  switch(RVar2) {
  case kPoint:
    geo_local = (Geometry *)0x3ff0000000000000;
    goto LAB_0091b917;
  case kSegment:
    local_80 = 0.5;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_78,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30,&local_80);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_78);
    break;
  case kTria:
    local_40 = 0.5;
    local_a8 = 0.3333333333333333;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30,&local_a8);
    local_b0 = 0.3333333333333333;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(&local_a0,&local_b0)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_a0);
    break;
  case kQuad:
    local_d8 = 0.5;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_d0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30,&local_d8);
    local_e0 = 0.5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(&local_d0,&local_e0)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_d0);
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_268);
    poVar4 = std::operator<<(local_258,"Volume not available for ");
    iVar3 = (*geo->_vptr_Geometry[2])();
    local_289.type_ = (RefElType)iVar3;
    lf::base::RefEl::ToString_abi_cxx11_(&local_288,&local_289);
    std::operator<<(poVar4,(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"false",&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/geometry_interface.cc"
               ,&local_2d9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_2b0,&local_2d8,0x23,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"this code should not be reached");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar1 = local_40;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_328,
             (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
  (*geo->_vptr_Geometry[6])(&local_310,geo,&local_328);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_310,0);
  geo_local = (Geometry *)(dVar1 * *pSVar5);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_310);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_328);
LAB_0091b917:
  local_58 = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  return (double)geo_local;
}

Assistant:

double Volume(const Geometry& geo) {
  const lf::base::dim_t refdim = geo.DimLocal();

  Eigen::Matrix<double, Eigen::Dynamic, 1> refc(refdim, 1);
  double refvol = 1.0;
  switch (geo.RefEl()) {
    case lf::base::RefEl::kPoint(): {
      return 1.0;
    }
    case lf::base::RefEl::kSegment(): {
      refc << 0.5;
      break;
    }
    case lf::base::RefEl::kTria(): {
      refvol = 0.5;
      refc << 1.0 / 3, 1.0 / 3;
      break;
    }
    case lf::base::RefEl::kQuad(): {
      refc << 0.5, 0.5;
      break;
    }
    default: {
      LF_VERIFY_MSG(false,
                    "Volume not available for " << geo.RefEl().ToString());
    }
  }  // end switch RefEl
  return (refvol * ((geo.IntegrationElement(refc))[0]));
}